

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

FuncNode * __thiscall asmjit::BaseCompiler::addFunc(BaseCompiler *this,FuncNode *func)

{
  BaseNode *pBVar1;
  
  if (this->_func == (FuncNode *)0x0) {
    this->_func = func;
    BaseBuilder::addNode(&this->super_BaseBuilder,(BaseNode *)func);
    pBVar1 = (this->super_BaseBuilder)._cursor;
    BaseBuilder::addNode(&this->super_BaseBuilder,&func->_exitNode->super_BaseNode);
    BaseBuilder::addNode(&this->super_BaseBuilder,&func->_end->super_BaseNode);
    (this->super_BaseBuilder)._cursor = pBVar1;
    return func;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/compiler.cpp"
             ,0x98,"_func == nullptr");
}

Assistant:

FuncNode* BaseCompiler::addFunc(FuncNode* func) {
  ASMJIT_ASSERT(_func == nullptr);
  _func = func;

  addNode(func);                 // Function node.
  BaseNode* prev = cursor();     // {CURSOR}.
  addNode(func->exitNode());     // Function exit label.
  addNode(func->endNode());      // Function end sentinel.

  _setCursor(prev);
  return func;
}